

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CurveOnSurface.h
# Opt level: O1

void anurbs::
     CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>
     ::register_python(module *m)

{
  string name;
  is_new_style_constructor local_6a;
  type local_69;
  class_<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_anurbs::CurveBase<3L>,_std::shared_ptr<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>_>_>
  local_68;
  long *local_60;
  long local_50 [2];
  arg local_40;
  arg local_30;
  arg local_20;
  
  CurveOnSurface<3l,std::shared_ptr<anurbs::NurbsCurveGeometry<2l>>,std::shared_ptr<anurbs::NurbsSurfaceGeometry<3l>>>
  ::python_name_abi_cxx11_();
  pybind11::
  class_<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_anurbs::CurveBase<3L>,_std::shared_ptr<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>_>_>
  ::class_<>(&local_68,(m->super_object).super_handle.m_ptr,(char *)local_60);
  local_20.name = "curve_geometry";
  local_20._8_1_ = 2;
  local_30.name = "surface_geometry";
  local_30._8_1_ = 2;
  local_40.name = "domain";
  local_40._8_1_ = 2;
  pybind11::
  class_<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>,_anurbs::CurveBase<3L>,_std::shared_ptr<anurbs::CurveOnSurface<3L,_std::shared_ptr<anurbs::NurbsCurveGeometry<2L>_>,_std::shared_ptr<anurbs::NurbsSurfaceGeometry<3L>_>_>_>_>
  ::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_oberbichler[P]ANurbs_external_libraries_pybind11_include_pybind11_detail_init_h:173:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg,_pybind11::arg,_pybind11::arg>
            (&local_68,"__init__",&local_69,&local_6a,&local_20,&local_30,&local_40);
  pybind11::object::~object((object *)&local_68);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  return;
}

Assistant:

static void register_python(pybind11::module& m)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = CurveOnSurface<TDimension>;
        using Base = CurveBase<TDimension>;
        using Holder = Pointer<Type>;

        const std::string name = Type::python_name();

        py::class_<Type, Base, Holder>(m, name.c_str())
            .def(py::init<TCurveRef, TSurfaceRef,
                Interval>(), "curve_geometry"_a, "surface_geometry"_a,
                "domain"_a)
        ;
    }